

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::Assignment::visitExpressions(Assignment *this,ExpressionVisitorFn fn)

{
  bool bVar1;
  Expression *pEVar2;
  pool_ptr<soul::heart::Expression> local_38 [3];
  pool_ptr<soul::heart::Expression> local_20;
  pool_ref<soul::heart::Expression> ref;
  ExpressionVisitorFn fn_local;
  Assignment *this_local;
  
  ref.object = (Expression *)fn;
  bVar1 = pool_ptr<soul::heart::Expression>::operator!=(&this->target,(void *)0x0);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::heart::Expression>::operator->(&this->target);
    (*(pEVar2->super_Object)._vptr_Object[3])(pEVar2,ref.object);
    pool_ptr<soul::heart::Expression>::getAsPoolRef(&local_20);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              ((function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)> *)
               ref.object,(pool_ref<soul::heart::Expression> *)&local_20,write);
    pool_ref::operator_cast_to_pool_ptr((pool_ref *)local_38);
    (this->target).object = local_38[0].object;
    pool_ptr<soul::heart::Expression>::~pool_ptr(local_38);
    pool_ref<soul::heart::Expression>::~pool_ref((pool_ref<soul::heart::Expression> *)&local_20);
  }
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            if (target != nullptr)
            {
                target->visitExpressions (fn, AccessType::write);
                auto ref = target.getAsPoolRef();
                fn (ref, AccessType::write);
                target = ref;
            }
        }